

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdsubrs.c
# Opt level: O0

void KB_enable(LispPTR *args)

{
  LispPTR *args_local;
  
  if (*args == 0x4c) {
    enable_Xkeyboard(currentdsp);
  }
  else if (*args == 0) {
    disable_Xkeyboard(currentdsp);
  }
  else {
    error("KB_enable: illegal arg \n");
    printf("KB_enable: arg = %d\n",(ulong)*args);
  }
  return;
}

Assistant:

void KB_enable(LispPTR *args) /* args[0] :	ON/OFF flag
                                     *		T -- ON
                                     *		NIL -- OFF
                                     */
{
  if (args[0] == ATOM_T) {
#if   XWINDOW
    enable_Xkeyboard(currentdsp);
#elif DOS
    (currentkbd->device.enter)(currentkbd);
#endif /* DOS */
  } else if (args[0] == NIL) {
#if   XWINDOW
    disable_Xkeyboard(currentdsp);
#elif DOS
    (currentkbd->device.exit)(currentkbd);
#endif /* DOS */
  } else {
    error("KB_enable: illegal arg \n");
    printf("KB_enable: arg = %d\n", args[0]);
  }
}